

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::btranL(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  const_reference pvVar8;
  HighsInt *in_RDX;
  int iVar9;
  HVector *in_RSI;
  long in_RDI;
  double *in_XMM0_Qa;
  double dVar10;
  double *lr_value_1;
  HighsInt *lr_index_1;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double pivot_multiplier;
  HighsInt pivotRow;
  HighsInt i;
  HighsInt rhs_count;
  double *lr_value;
  HighsInt *lr_index;
  HighsInt *lr_start;
  double *rhs_array;
  HighsInt *rhs_index;
  bool sparse_solve;
  double current_density;
  FactorTimer factor_timer;
  HighsTimerClock *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  HighsInt HVar11;
  HVectorBase<double> *in_stack_ffffffffffffff30;
  HVectorBase<double> *in_stack_ffffffffffffff50;
  bool local_99;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_68;
  int local_64;
  HighsInt *in_stack_ffffffffffffffa8;
  HighsInt *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  HighsInt *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  
  FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,
                     (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20)
  ;
  dVar10 = (double)in_RSI->count * 1.0 * *(double *)(in_RDI + 0xd8);
  local_99 = true;
  if ((-1 < in_RSI->count) && (local_99 = true, dVar10 <= 0.05)) {
    local_99 = 0.1 < (double)in_XMM0_Qa;
  }
  HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (local_99 == false) {
    FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
    HVar11 = (HighsInt)((ulong)dVar10 >> 0x20);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d066c);
    in_stack_ffffffffffffff20 =
         (HighsTimerClock *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x7d0682);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d06a2);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d06b8);
    in_stack_ffffffffffffff50 =
         (HVectorBase<double> *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d06ce)
    ;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4e0),1);
    solveHyper(HVar11,(HighsInt *)CONCAT17(local_99,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_RDX,in_XMM0_Qa,in_RSI);
    HVar11 = (HighsInt)((ulong)in_RSI >> 0x20);
    FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  }
  else {
    FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
    piVar3 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7d0401);
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7d041a);
    piVar5 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7d0433);
    piVar6 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7d044c);
    pdVar7 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7d0465);
    local_64 = 0;
    iVar2 = *(int *)(in_RDI + 200);
    while( true ) {
      HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      local_68 = iVar2 + -1;
      if (local_68 < 0) break;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_68);
      iVar1 = *pvVar8;
      dVar10 = pdVar4[iVar1];
      if (ABS(dVar10) <= 1e-14) {
        pdVar4[iVar1] = 0.0;
        iVar2 = local_68;
      }
      else {
        iVar9 = local_64 + 1;
        piVar3[local_64] = iVar1;
        pdVar4[iVar1] = dVar10;
        in_stack_ffffffffffffff80 = piVar5[iVar2];
        in_stack_ffffffffffffff84 = piVar5[local_68];
        for (in_stack_ffffffffffffff7c = in_stack_ffffffffffffff84; local_64 = iVar9,
            iVar2 = local_68, in_stack_ffffffffffffff7c < in_stack_ffffffffffffff80;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          pdVar4[piVar6[in_stack_ffffffffffffff7c]] =
               -dVar10 * pdVar7[in_stack_ffffffffffffff7c] +
               pdVar4[piVar6[in_stack_ffffffffffffff7c]];
        }
      }
    }
    in_RSI->count = local_64;
    FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  }
  if (*(int *)(in_RDI + 0x198) == 4) {
    FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
    btranAPF((HFactor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (HVector *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    HVectorBase<double>::tight(in_stack_ffffffffffffff50);
    HVectorBase<double>::pack(in_stack_ffffffffffffff30);
    FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  }
  FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  return;
}

Assistant:

void HFactor::btranL(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorBtranLower, factor_timer_clock_pointer);

  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperBtranL;
  if (sparse_solve) {
    factor_timer.start(FactorBtranLowerSps, factor_timer_clock_pointer);
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor L
    const HighsInt* lr_start = this->lr_start.data();
    const HighsInt* lr_index = this->lr_index.data();
    const double* lr_value = this->lr_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    for (HighsInt i = num_row - 1; i >= 0; i--) {
      HighsInt pivotRow = l_pivot_index[i];
      const double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = lr_start[i];
        const HighsInt end = lr_start[i + 1];
        for (HighsInt k = start; k < end; k++)
          rhs_array[lr_index[k]] -= pivot_multiplier * lr_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    factor_timer.stop(FactorBtranLowerSps, factor_timer_clock_pointer);
  } else {
    // Hyper-sparse solve
    factor_timer.start(FactorBtranLowerHyper, factor_timer_clock_pointer);
    const HighsInt* lr_index = this->lr_index.data();
    const double* lr_value = this->lr_value.data();
    solveHyper(num_row, l_pivot_lookup.data(), l_pivot_index.data(), 0,
               lr_start.data(), &lr_start[1], &lr_index[0], &lr_value[0], &rhs);
    factor_timer.stop(FactorBtranLowerHyper, factor_timer_clock_pointer);
  }

  if (update_method == kUpdateMethodApf) {
    factor_timer.start(FactorBtranLowerAPF, factor_timer_clock_pointer);
    btranAPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorBtranLowerAPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorBtranLower, factor_timer_clock_pointer);
}